

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O2

bool __thiscall Vertex::doesMatchWithErrors(Vertex *this,string *sequence)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = (uint)sequence->_M_string_length;
  uVar4 = 0;
  uVar3 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar3 = uVar4;
  }
  uVar5 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    cVar1 = (this->seq_del)._M_dataplus._M_p[uVar4];
    cVar2 = (sequence->_M_dataplus)._M_p[uVar4];
    uVar5 = uVar5 + (cVar2 == 'X' || (cVar1 == 'X' || cVar1 == cVar2));
  }
  return ~(ulong)(5 < this->treshhold) + (this->seq)._M_string_length <= (ulong)uVar5;
}

Assistant:

bool Vertex::doesMatchWithErrors(string sequence){
    int count = 0;
    for(int i = 0; i < (int)sequence.size(); i++){
        if(this->seq_del[i] == sequence[i] or this->seq_del[i] == 'X' or sequence[i] == 'X'){
            count++;
        }
    }
    return this->treshhold > 5 ? count >= seq.size() - 2 : count >= seq.size() - 1;
}